

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O3

uint32_t __thiscall
icu_63::CollationRootElements::getTertiaryAfter
          (CollationRootElements *this,int32_t index,uint32_t s,uint32_t t)

{
  uint32_t uVar1;
  uint *puVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint uVar5;
  uint uVar6;
  
  if (index == 0) {
    puVar4 = this->elements;
    if (s == 0) {
      uVar1 = 0x4000;
      puVar3 = puVar4;
    }
    else {
      uVar1 = (puVar4[4] & 0xff) << 8;
      puVar3 = puVar4 + 1;
    }
    index = *puVar3;
    uVar5 = puVar4[index] & 0xffffff7f;
  }
  else {
    puVar4 = this->elements;
    uVar5 = puVar4[(long)index + 1] & 0xffffff7f;
    if (0x50004ff < uVar5) {
      uVar5 = 0x5000500;
    }
    if (-1 < (char)puVar4[(long)index + 1]) {
      uVar5 = 0x5000500;
    }
    uVar1 = (puVar4[4] & 0xff) << 8;
  }
  uVar6 = s << 0x10 | t;
  if (uVar5 <= uVar6) {
    puVar2 = puVar4 + index;
    do {
      puVar2 = puVar2 + 1;
      uVar5 = *puVar2;
      if (-1 < (char)uVar5) {
        return uVar1;
      }
      if (s < uVar5 >> 0x10) {
        return uVar1;
      }
      uVar5 = uVar5 & 0xffffff7f;
    } while (uVar5 <= uVar6);
  }
  return uVar5 & 0xffff;
}

Assistant:

uint32_t
CollationRootElements::getTertiaryAfter(int32_t index, uint32_t s, uint32_t t) const {
    uint32_t secTer;
    uint32_t terLimit;
    if(index == 0) {
        // primary = 0
        if(s == 0) {
            U_ASSERT(t != 0);
            index = (int32_t)elements[IX_FIRST_TERTIARY_INDEX];
            // Gap at the end of the tertiary CE range.
            terLimit = 0x4000;
        } else {
            index = (int32_t)elements[IX_FIRST_SECONDARY_INDEX];
            // Gap for tertiaries of primary/secondary CEs.
            terLimit = getTertiaryBoundary();
        }
        secTer = elements[index] & ~SEC_TER_DELTA_FLAG;
    } else {
        U_ASSERT(index >= (int32_t)elements[IX_FIRST_PRIMARY_INDEX]);
        secTer = getFirstSecTerForPrimary(index + 1);
        // If this is an explicit sec/ter unit, then it will be read once more.
        terLimit = getTertiaryBoundary();
    }
    uint32_t st = (s << 16) | t;
    for(;;) {
        if(secTer > st) {
            U_ASSERT((secTer >> 16) == s);
            return secTer & 0xffff;
        }
        secTer = elements[++index];
        // No tertiary greater than t for this primary+secondary.
        if((secTer & SEC_TER_DELTA_FLAG) == 0 || (secTer >> 16) > s) { return terLimit; }
        secTer &= ~SEC_TER_DELTA_FLAG;
    }
}